

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSingle.c
# Opt level: O1

void Fxu_MatrixComputeSinglesOne(Fxu_Matrix *p,Fxu_Var *pVar)

{
  int iVar1;
  Fxu_Lit *pFVar2;
  Fxu_Lit *pFVar3;
  Fxu_Matrix *p_00;
  Fxu_Var *pFVar4;
  
  p->ppTailVars = &p->pOrderVars;
  p->pOrderVars = (Fxu_Var *)0x0;
  p_00 = p;
  for (pFVar2 = (pVar->lLits).pHead; pFVar2 != (Fxu_Lit *)0x0; pFVar2 = pFVar2->pVNext) {
    for (pFVar3 = pFVar2->pHPrev; pFVar3 != (Fxu_Lit *)0x0; pFVar3 = pFVar3->pHPrev) {
      pFVar4 = pFVar3->pVar;
      if (pFVar4->pOrder == (Fxu_Var *)0x0) {
        p_00 = (Fxu_Matrix *)&pFVar4->pOrder;
        *p->ppTailVars = pFVar4;
        p->ppTailVars = (Fxu_Var **)p_00;
        pFVar4->pOrder = (Fxu_Var *)0x1;
      }
    }
  }
  pFVar4 = p->pOrderVars;
  if ((Fxu_Var *)0x1 < pFVar4) {
    do {
      iVar1 = Fxu_SingleCountCoincidence(p_00,pFVar4,pVar);
      if (iVar1 < 1) {
        __assert_fail("Coin > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxu/fxuSingle.c"
                      ,0xd9,"void Fxu_MatrixComputeSinglesOne(Fxu_Matrix *, Fxu_Var *)");
      }
      if (p->nWeightLimit <= iVar1 + -2) {
        p_00 = p;
        Fxu_MatrixAddSingle(p,pFVar4,pVar,iVar1 + -2);
      }
      pFVar4 = pFVar4->pOrder;
    } while (pFVar4 != (Fxu_Var *)0x1);
  }
  Fxu_MatrixRingVarsUnmark(p);
  return;
}

Assistant:

void Fxu_MatrixComputeSinglesOne( Fxu_Matrix * p, Fxu_Var * pVar )
{
    Fxu_Lit * pLitV, * pLitH;
    Fxu_Var * pVar2;
    int Coin;
    int WeightCur;

    // start collecting the affected vars
    Fxu_MatrixRingVarsStart( p );
    // go through all the literals of this variable
    for ( pLitV = pVar->lLits.pHead; pLitV; pLitV = pLitV->pVNext )
        // for this literal, go through all the horizontal literals
        for ( pLitH = pLitV->pHPrev; pLitH; pLitH = pLitH->pHPrev )
        {
            // get another variable
            pVar2 = pLitH->pVar;
            // skip the var if it is already used
            if ( pVar2->pOrder )
                continue;
            // skip the var if it belongs to the same node
//            if ( pValue2Node[pVar->iVar] == pValue2Node[pVar2->iVar] )
//                continue;
            // collect the var
            Fxu_MatrixRingVarsAdd( p, pVar2 );
        }
    // stop collecting the selected vars
    Fxu_MatrixRingVarsStop( p );

    // iterate through the selected vars
    Fxu_MatrixForEachVarInRing( p, pVar2 )
    {
        // count the coincidence
        Coin = Fxu_SingleCountCoincidence( p, pVar2, pVar );
        assert( Coin > 0 );
        // get the new weight
        WeightCur = Coin - 2;
        // peformance fix (August 24, 2007)
//        if ( WeightCur >= 0 )
//        Fxu_MatrixAddSingle( p, pVar2, pVar, WeightCur );
        if ( WeightCur >= p->nWeightLimit )
            Fxu_MatrixAddSingle( p, pVar2, pVar, WeightCur );
    }
    // unmark the vars
    Fxu_MatrixRingVarsUnmark( p );
}